

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int require_comma(Context_conflict *ctx)

{
  Token TVar1;
  Token token;
  Context_conflict *ctx_local;
  
  TVar1 = nexttoken(ctx);
  if (TVar1 != 0x2c) {
    fail(ctx,"Comma expected");
  }
  ctx_local._4_4_ = (uint)(TVar1 == 0x2c);
  return ctx_local._4_4_;
}

Assistant:

static int require_comma(Context *ctx)
{
    const Token token = nexttoken(ctx);
    if (token != ((Token) ','))
    {
        fail(ctx, "Comma expected");
        return 0;
    } // if
    return 1;
}